

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O0

void __thiscall adios2::transport::ShmSystemV::CheckBuffer(ShmSystemV *this,string *hint)

{
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_158 [16];
  unsigned_long in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [39];
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  if (*(long *)(in_RDI + 0x118) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Toolkit",&local_31);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_69 + 1),"transport::shm::ShmSystemV",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_91 + 1),"CheckBuffer",(allocator *)__rhs);
    std::__cxx11::to_string(in_stack_fffffffffffffeb8);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void ShmSystemV::CheckBuffer(const std::string hint) const
{
    if (m_Buffer == nullptr)
    {
        helper::Throw<std::ios_base::failure>(
            "Toolkit", "transport::shm::ShmSystemV", "CheckBuffer",
            "nullptr shared memory segment of size " + std::to_string(m_Size) + " and name " +
                m_Name + " " + hint);
    }
}